

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerTester.cpp
# Opt level: O2

void __thiscall psy::C::TypeCheckerTester::case0556(TypeCheckerTester *this)

{
  allocator<char> local_e1;
  string local_e0;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,
             "\nstruct s { int m ; } t ;\nvoid _ ()\n{\n    struct s x ;\n    & x ;\n}\n",&local_e1)
  ;
  Expectation::Expectation(&local_c0);
  checkTypes(this,&local_e0,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void TypeCheckerTester::case0556()
{
    auto s = R"(
struct s { int m ; } t ;
void _ ()
{
    struct s x ;
    & x ;
}
)";

    checkTypes(s, Expectation());
}